

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto.cpp
# Opt level: O1

void __thiscall cppcms::crypto::hmac::readout(hmac *this,void *ptr)

{
  message_digest *pmVar1;
  pointer puVar2;
  uint uVar3;
  EVP_PKEY_CTX *ctx;
  vector<unsigned_char,_std::allocator<unsigned_char>_> digest;
  value_type_conflict3 local_3a;
  allocator_type local_39;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  
  uVar3 = (*((this->md_)._M_t.
             super___uniq_ptr_impl<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
             ._M_t.
             super__Tuple_impl<0UL,_cppcms::crypto::message_digest_*,_std::default_delete<cppcms::crypto::message_digest>_>
             .super__Head_base<0UL,_cppcms::crypto::message_digest_*,_false>._M_head_impl)->
            _vptr_message_digest[2])();
  local_3a = '\0';
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_38,(ulong)uVar3,&local_3a,&local_39);
  pmVar1 = (this->md_)._M_t.
           super___uniq_ptr_impl<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
           ._M_t.
           super__Tuple_impl<0UL,_cppcms::crypto::message_digest_*,_std::default_delete<cppcms::crypto::message_digest>_>
           .super__Head_base<0UL,_cppcms::crypto::message_digest_*,_false>._M_head_impl;
  (*pmVar1->_vptr_message_digest[5])
            (pmVar1,local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  puVar2 = local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  pmVar1 = (this->md_opad_)._M_t.
           super___uniq_ptr_impl<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
           ._M_t.
           super__Tuple_impl<0UL,_cppcms::crypto::message_digest_*,_std::default_delete<cppcms::crypto::message_digest>_>
           .super__Head_base<0UL,_cppcms::crypto::message_digest_*,_false>._M_head_impl;
  uVar3 = (*((this->md_)._M_t.
             super___uniq_ptr_impl<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
             ._M_t.
             super__Tuple_impl<0UL,_cppcms::crypto::message_digest_*,_std::default_delete<cppcms::crypto::message_digest>_>
             .super__Head_base<0UL,_cppcms::crypto::message_digest_*,_false>._M_head_impl)->
            _vptr_message_digest[2])();
  (*pmVar1->_vptr_message_digest[4])(pmVar1,puVar2,(ulong)uVar3);
  pmVar1 = (this->md_opad_)._M_t.
           super___uniq_ptr_impl<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
           ._M_t.
           super__Tuple_impl<0UL,_cppcms::crypto::message_digest_*,_std::default_delete<cppcms::crypto::message_digest>_>
           .super__Head_base<0UL,_cppcms::crypto::message_digest_*,_false>._M_head_impl;
  (*pmVar1->_vptr_message_digest[5])(pmVar1,ptr);
  uVar3 = (*((this->md_)._M_t.
             super___uniq_ptr_impl<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
             ._M_t.
             super__Tuple_impl<0UL,_cppcms::crypto::message_digest_*,_std::default_delete<cppcms::crypto::message_digest>_>
             .super__Head_base<0UL,_cppcms::crypto::message_digest_*,_false>._M_head_impl)->
            _vptr_message_digest[2])();
  ctx = (EVP_PKEY_CTX *)(ulong)uVar3;
  local_3a = '\0';
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_fill_assign
            (&local_38,(size_type)ctx,&local_3a);
  init(this,ctx);
  if (local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void hmac::readout(void *ptr)
	{
		std::vector<unsigned char> digest(md_->digest_size(),0);
		md_->readout(&digest.front()); // md_ is reset
		md_opad_->append(&digest.front(),md_->digest_size());
		md_opad_->readout(ptr); // md_opad_ is reset now
		digest.assign(md_->digest_size(),0);
		init();
	}